

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar12;
  ushort uVar13;
  uint uVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  RTCRayQueryContext *pRVar20;
  bool bVar21;
  float fVar22;
  undefined1 auVar23 [16];
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  byte bVar43;
  byte bVar44;
  uint uVar45;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar46) [32];
  long lVar47;
  ulong uVar48;
  long lVar49;
  byte bVar50;
  uint uVar51;
  uint uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  float fVar64;
  float fVar100;
  float fVar101;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar102;
  undefined1 auVar70 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined4 uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined8 uVar127;
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 in_XMM27 [16];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong *local_27c0;
  undefined1 local_27b1;
  RayHit *local_27b0;
  RayQueryContext *local_27a8;
  RTCIntersectArguments *local_27a0;
  ulong local_2798;
  ulong local_2790;
  ulong local_2788;
  ulong local_2780;
  ulong local_2778;
  ulong local_2770;
  ulong local_2768;
  uint local_2760;
  uint local_275c;
  uint local_2758;
  int local_2754;
  long local_2750;
  ulong local_2748;
  long local_2740;
  long local_2738;
  long local_2730;
  long local_2728;
  Scene *local_2720;
  ulong local_2718;
  RTCFilterFunctionNArguments local_2710;
  undefined1 local_26e0 [32];
  float local_26b0;
  float local_26ac;
  float local_26a8;
  undefined4 local_26a4;
  undefined4 local_26a0;
  undefined4 local_269c;
  undefined4 local_2698;
  uint local_2694;
  uint local_2690;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [8];
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined1 local_2600 [8];
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  undefined1 local_25e0 [8];
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 *local_2560;
  byte local_2558;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  float local_24e0 [4];
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  uint uStack_24c4;
  float local_24c0 [4];
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  float local_24a0 [4];
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar67 [16];
  undefined1 auVar76 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27c0 = local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar70 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar118 = (ray->super_RayK<1>).tfar;
    auVar109 = ZEXT464((uint)fVar118);
    auVar65._8_4_ = 0x7fffffff;
    auVar65._0_8_ = 0x7fffffff7fffffff;
    auVar65._12_4_ = 0x7fffffff;
    auVar65 = vandps_avx512vl((undefined1  [16])aVar2,auVar65);
    auVar66._8_4_ = 0x219392ef;
    auVar66._0_8_ = 0x219392ef219392ef;
    auVar66._12_4_ = 0x219392ef;
    uVar56 = vcmpps_avx512vl(auVar65,auVar66,1);
    local_2398[0] = 0;
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar65 = vdivps_avx(auVar68,(undefined1  [16])aVar2);
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar21 = (bool)((byte)uVar56 & 1);
    auVar67._0_4_ = (uint)bVar21 * auVar66._0_4_ | (uint)!bVar21 * auVar65._0_4_;
    bVar21 = (bool)((byte)(uVar56 >> 1) & 1);
    auVar67._4_4_ = (uint)bVar21 * auVar66._4_4_ | (uint)!bVar21 * auVar65._4_4_;
    bVar21 = (bool)((byte)(uVar56 >> 2) & 1);
    auVar67._8_4_ = (uint)bVar21 * auVar66._8_4_ | (uint)!bVar21 * auVar65._8_4_;
    bVar21 = (bool)((byte)(uVar56 >> 3) & 1);
    auVar67._12_4_ = (uint)bVar21 * auVar66._12_4_ | (uint)!bVar21 * auVar65._12_4_;
    auVar23._8_4_ = 0x3f7ffffa;
    auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar23._12_4_ = 0x3f7ffffa;
    auVar68 = vmulps_avx512vl(auVar67,auVar23);
    auVar69._8_4_ = 0x3f800003;
    auVar69._0_8_ = 0x3f8000033f800003;
    auVar69._12_4_ = 0x3f800003;
    auVar69 = vmulps_avx512vl(auVar67,auVar69);
    uVar115 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2680._4_4_ = uVar115;
    local_2680._0_4_ = uVar115;
    local_2680._8_4_ = uVar115;
    local_2680._12_4_ = uVar115;
    local_2680._16_4_ = uVar115;
    local_2680._20_4_ = uVar115;
    local_2680._24_4_ = uVar115;
    local_2680._28_4_ = uVar115;
    auVar65 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar118));
    uVar115 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_26e0._4_4_ = uVar115;
    local_26e0._0_4_ = uVar115;
    local_26e0._8_4_ = uVar115;
    local_26e0._12_4_ = uVar115;
    local_26e0._16_4_ = uVar115;
    local_26e0._20_4_ = uVar115;
    local_26e0._24_4_ = uVar115;
    local_26e0._28_4_ = uVar115;
    uVar115 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar115;
    local_2400._0_4_ = uVar115;
    local_2400._8_4_ = uVar115;
    local_2400._12_4_ = uVar115;
    local_2400._16_4_ = uVar115;
    local_2400._20_4_ = uVar115;
    local_2400._24_4_ = uVar115;
    local_2400._28_4_ = uVar115;
    auVar140 = ZEXT3264(local_2400);
    fVar118 = auVar68._0_4_;
    local_25e0._4_4_ = fVar118;
    local_25e0._0_4_ = fVar118;
    fStack_25d8 = fVar118;
    fStack_25d4 = fVar118;
    fStack_25d0 = fVar118;
    fStack_25cc = fVar118;
    fStack_25c8 = fVar118;
    register0x0000151c = fVar118;
    auVar66 = vmovshdup_avx(auVar68);
    uVar127 = auVar66._0_8_;
    register0x00001548 = uVar127;
    local_2600 = uVar127;
    register0x00001550 = uVar127;
    register0x00001558 = uVar127;
    auVar23 = vshufpd_avx(auVar68,auVar68,1);
    auVar71._8_4_ = 2;
    auVar71._0_8_ = 0x200000002;
    auVar71._12_4_ = 2;
    auVar71._16_4_ = 2;
    auVar71._20_4_ = 2;
    auVar71._24_4_ = 2;
    auVar71._28_4_ = 2;
    _local_2620 = vpermps_avx2(auVar71,ZEXT1632(auVar68));
    fVar104 = auVar69._0_4_;
    auVar72._8_4_ = 1;
    auVar72._0_8_ = 0x100000001;
    auVar72._12_4_ = 1;
    auVar72._16_4_ = 1;
    auVar72._20_4_ = 1;
    auVar72._24_4_ = 1;
    auVar72._28_4_ = 1;
    local_2440 = vpermps_avx2(auVar72,ZEXT1632(auVar69));
    auVar146 = ZEXT3264(local_2440);
    local_2460 = vpermps_avx512vl(auVar71,ZEXT1632(auVar69));
    auVar147 = ZEXT3264(local_2460);
    auVar131 = ZEXT3264(_local_2620);
    uVar48 = (ulong)(fVar118 < 0.0) << 5;
    auVar128 = ZEXT3264(local_26e0);
    uVar58 = (ulong)(auVar66._0_4_ < 0.0) << 5 | 0x40;
    auVar132 = ZEXT3264(_local_25e0);
    auVar129 = ZEXT3264(local_2680);
    auVar136 = ZEXT3264(_local_2600);
    uVar59 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x80;
    uVar60 = uVar48 ^ 0x20;
    uVar61 = uVar58 ^ 0x20;
    uVar56 = uVar59 ^ 0x20;
    uVar115 = auVar70._0_4_;
    local_2480._4_4_ = uVar115;
    local_2480._0_4_ = uVar115;
    local_2480._8_4_ = uVar115;
    local_2480._12_4_ = uVar115;
    local_2480._16_4_ = uVar115;
    local_2480._20_4_ = uVar115;
    local_2480._24_4_ = uVar115;
    local_2480._28_4_ = uVar115;
    auVar144 = ZEXT3264(local_2480);
    auVar71 = vbroadcastss_avx512vl(auVar65);
    auVar148 = ZEXT3264(auVar71);
    auVar139 = ZEXT3264(_DAT_01fe9900);
    auVar71 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar149 = ZEXT3264(auVar71);
    local_2420 = fVar104;
    fStack_241c = fVar104;
    fStack_2418 = fVar104;
    fStack_2414 = fVar104;
    fStack_2410 = fVar104;
    fStack_240c = fVar104;
    fStack_2408 = fVar104;
    fStack_2404 = fVar104;
    fVar118 = fVar104;
    fVar64 = fVar104;
    fVar100 = fVar104;
    fVar101 = fVar104;
    fVar102 = fVar104;
    fVar103 = fVar104;
    local_27b0 = ray;
    local_27a8 = context;
    local_2798 = uVar56;
    local_2790 = uVar61;
    local_2788 = uVar60;
    local_2780 = uVar59;
    local_2778 = uVar58;
    local_2770 = uVar48;
    do {
      pfVar1 = (float *)(local_27c0 + -1);
      local_27c0 = local_27c0 + -2;
      if (*pfVar1 <= auVar109._0_4_) {
        uVar62 = *local_27c0;
        while( true ) {
          if ((uVar62 & 8) != 0) break;
          pauVar46 = (undefined1 (*) [32])(uVar62 & 0xfffffffffffffff0);
          uVar115 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar112._4_4_ = uVar115;
          auVar112._0_4_ = uVar115;
          auVar112._8_4_ = uVar115;
          auVar112._12_4_ = uVar115;
          auVar112._16_4_ = uVar115;
          auVar112._20_4_ = uVar115;
          auVar112._24_4_ = uVar115;
          auVar112._28_4_ = uVar115;
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar46[8] + uVar48),auVar112,
                                    *(undefined1 (*) [32])(pauVar46[2] + uVar48));
          auVar71 = vsubps_avx(ZEXT1632(auVar65),auVar129._0_32_);
          auVar32._4_4_ = auVar132._4_4_ * auVar71._4_4_;
          auVar32._0_4_ = auVar132._0_4_ * auVar71._0_4_;
          auVar32._8_4_ = auVar132._8_4_ * auVar71._8_4_;
          auVar32._12_4_ = auVar132._12_4_ * auVar71._12_4_;
          auVar32._16_4_ = auVar132._16_4_ * auVar71._16_4_;
          auVar32._20_4_ = auVar132._20_4_ * auVar71._20_4_;
          auVar32._24_4_ = auVar132._24_4_ * auVar71._24_4_;
          auVar32._28_4_ = auVar71._28_4_;
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar46[8] + uVar58),auVar112,
                                    *(undefined1 (*) [32])(pauVar46[2] + uVar58));
          auVar71 = vsubps_avx(ZEXT1632(auVar65),auVar128._0_32_);
          auVar33._4_4_ = auVar136._4_4_ * auVar71._4_4_;
          auVar33._0_4_ = auVar136._0_4_ * auVar71._0_4_;
          auVar33._8_4_ = auVar136._8_4_ * auVar71._8_4_;
          auVar33._12_4_ = auVar136._12_4_ * auVar71._12_4_;
          auVar33._16_4_ = auVar136._16_4_ * auVar71._16_4_;
          auVar33._20_4_ = auVar136._20_4_ * auVar71._20_4_;
          auVar33._24_4_ = auVar136._24_4_ * auVar71._24_4_;
          auVar33._28_4_ = auVar71._28_4_;
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar46[8] + uVar59),auVar112,
                                    *(undefined1 (*) [32])(pauVar46[2] + uVar59));
          auVar71 = vsubps_avx(ZEXT1632(auVar65),auVar140._0_32_);
          auVar34._4_4_ = auVar131._4_4_ * auVar71._4_4_;
          auVar34._0_4_ = auVar131._0_4_ * auVar71._0_4_;
          auVar34._8_4_ = auVar131._8_4_ * auVar71._8_4_;
          auVar34._12_4_ = auVar131._12_4_ * auVar71._12_4_;
          auVar34._16_4_ = auVar131._16_4_ * auVar71._16_4_;
          auVar34._20_4_ = auVar131._20_4_ * auVar71._20_4_;
          auVar34._24_4_ = auVar131._24_4_ * auVar71._24_4_;
          auVar34._28_4_ = auVar71._28_4_;
          auVar71 = vmaxps_avx(auVar33,auVar34);
          auVar72 = vmaxps_avx(auVar144._0_32_,auVar32);
          auVar71 = vmaxps_avx(auVar72,auVar71);
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar46[8] + uVar60),auVar112,
                                    *(undefined1 (*) [32])(pauVar46[2] + uVar60));
          auVar72 = vsubps_avx(ZEXT1632(auVar65),auVar129._0_32_);
          auVar35._4_4_ = fVar118 * auVar72._4_4_;
          auVar35._0_4_ = fVar104 * auVar72._0_4_;
          auVar35._8_4_ = fVar64 * auVar72._8_4_;
          auVar35._12_4_ = fVar100 * auVar72._12_4_;
          auVar35._16_4_ = fVar101 * auVar72._16_4_;
          auVar35._20_4_ = fVar102 * auVar72._20_4_;
          auVar35._24_4_ = fVar103 * auVar72._24_4_;
          auVar35._28_4_ = auVar72._28_4_;
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar46[8] + uVar61),auVar112,
                                    *(undefined1 (*) [32])(pauVar46[2] + uVar61));
          auVar72 = vsubps_avx(ZEXT1632(auVar65),auVar128._0_32_);
          auVar36._4_4_ = auVar146._4_4_ * auVar72._4_4_;
          auVar36._0_4_ = auVar146._0_4_ * auVar72._0_4_;
          auVar36._8_4_ = auVar146._8_4_ * auVar72._8_4_;
          auVar36._12_4_ = auVar146._12_4_ * auVar72._12_4_;
          auVar36._16_4_ = auVar146._16_4_ * auVar72._16_4_;
          auVar36._20_4_ = auVar146._20_4_ * auVar72._20_4_;
          auVar36._24_4_ = auVar146._24_4_ * auVar72._24_4_;
          auVar36._28_4_ = auVar72._28_4_;
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar46[8] + uVar56),auVar112,
                                    *(undefined1 (*) [32])(pauVar46[2] + uVar56));
          auVar72 = vsubps_avx(ZEXT1632(auVar65),auVar140._0_32_);
          auVar72 = vmulps_avx512vl(auVar147._0_32_,auVar72);
          auVar72 = vminps_avx(auVar36,auVar72);
          auVar73 = vminps_avx512vl(auVar148._0_32_,auVar35);
          auVar72 = vminps_avx(auVar73,auVar72);
          uVar63 = vcmpps_avx512vl(auVar71,auVar72,2);
          if (((uint)uVar62 & 7) == 6) {
            uVar62 = vcmpps_avx512vl(auVar112,pauVar46[0xe],0xd);
            uVar24 = vcmpps_avx512vl(auVar112,pauVar46[0xf],1);
            uVar63 = uVar63 & uVar62 & uVar24;
          }
          bVar43 = (byte)uVar63;
          if (bVar43 == 0) {
            auVar65 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar109 = ZEXT1664(auVar65);
            goto LAB_01f3846e;
          }
          auVar72 = *pauVar46;
          auVar73 = pauVar46[1];
          auVar74 = vpternlogd_avx512vl(auVar139._0_32_,auVar71,auVar149._0_32_,0xf8);
          auVar75 = vpcompressd_avx512vl(auVar74);
          auVar76._0_4_ =
               (uint)(bVar43 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar43 & 1) * auVar74._0_4_;
          bVar21 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar76._4_4_ = (uint)bVar21 * auVar75._4_4_ | (uint)!bVar21 * auVar74._4_4_;
          bVar21 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar76._8_4_ = (uint)bVar21 * auVar75._8_4_ | (uint)!bVar21 * auVar74._8_4_;
          bVar21 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar76._12_4_ = (uint)bVar21 * auVar75._12_4_ | (uint)!bVar21 * auVar74._12_4_;
          bVar21 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar76._16_4_ = (uint)bVar21 * auVar75._16_4_ | (uint)!bVar21 * auVar74._16_4_;
          bVar21 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar76._20_4_ = (uint)bVar21 * auVar75._20_4_ | (uint)!bVar21 * auVar74._20_4_;
          bVar21 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar76._24_4_ = (uint)bVar21 * auVar75._24_4_ | (uint)!bVar21 * auVar74._24_4_;
          bVar21 = SUB81(uVar63 >> 7,0);
          auVar76._28_4_ = (uint)bVar21 * auVar75._28_4_ | (uint)!bVar21 * auVar74._28_4_;
          auVar74 = vpermt2q_avx512vl(auVar72,auVar76,auVar73);
          uVar62 = auVar74._0_8_;
          bVar43 = bVar43 - 1 & bVar43;
          if (bVar43 != 0) {
            auVar74 = vpshufd_avx2(auVar76,0x55);
            vpermt2q_avx512vl(auVar72,auVar74,auVar73);
            auVar75 = vpminsd_avx2(auVar76,auVar74);
            auVar74 = vpmaxsd_avx2(auVar76,auVar74);
            bVar43 = bVar43 - 1 & bVar43;
            if (bVar43 == 0) {
              auVar75 = vpermi2q_avx512vl(auVar75,auVar72,auVar73);
              uVar62 = auVar75._0_8_;
              auVar72 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
              *local_27c0 = auVar72._0_8_;
              auVar71 = vpermd_avx2(auVar74,auVar71);
              *(int *)(local_27c0 + 1) = auVar71._0_4_;
              local_27c0 = local_27c0 + 2;
              auVar128 = ZEXT3264(local_26e0);
            }
            else {
              auVar81 = vpshufd_avx2(auVar76,0xaa);
              vpermt2q_avx512vl(auVar72,auVar81,auVar73);
              auVar79 = vpminsd_avx2(auVar75,auVar81);
              auVar75 = vpmaxsd_avx2(auVar75,auVar81);
              auVar81 = vpminsd_avx2(auVar74,auVar75);
              auVar74 = vpmaxsd_avx2(auVar74,auVar75);
              bVar43 = bVar43 - 1 & bVar43;
              if (bVar43 == 0) {
                auVar75 = vpermi2q_avx512vl(auVar79,auVar72,auVar73);
                uVar62 = auVar75._0_8_;
                auVar75 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
                *local_27c0 = auVar75._0_8_;
                auVar74 = vpermd_avx2(auVar74,auVar71);
                *(int *)(local_27c0 + 1) = auVar74._0_4_;
                auVar72 = vpermt2q_avx512vl(auVar72,auVar81,auVar73);
                local_27c0[2] = auVar72._0_8_;
                auVar71 = vpermd_avx2(auVar81,auVar71);
                *(int *)(local_27c0 + 3) = auVar71._0_4_;
                local_27c0 = local_27c0 + 4;
                auVar129 = ZEXT3264(local_2680);
                auVar128 = ZEXT3264(local_26e0);
                auVar131 = ZEXT3264(auVar131._0_32_);
              }
              else {
                auVar75 = vpshufd_avx2(auVar76,0xff);
                vpermt2q_avx512vl(auVar72,auVar75,auVar73);
                auVar78 = vpminsd_avx2(auVar79,auVar75);
                auVar75 = vpmaxsd_avx2(auVar79,auVar75);
                auVar79 = vpminsd_avx2(auVar81,auVar75);
                auVar75 = vpmaxsd_avx2(auVar81,auVar75);
                auVar81 = vpminsd_avx2(auVar74,auVar75);
                auVar74 = vpmaxsd_avx2(auVar74,auVar75);
                bVar43 = bVar43 - 1 & bVar43;
                if (bVar43 == 0) {
                  auVar75 = vpermi2q_avx512vl(auVar78,auVar72,auVar73);
                  uVar62 = auVar75._0_8_;
                  auVar75 = vpermt2q_avx512vl(auVar72,auVar74,auVar73);
                  *local_27c0 = auVar75._0_8_;
                  auVar74 = vpermd_avx2(auVar74,auVar71);
                  *(int *)(local_27c0 + 1) = auVar74._0_4_;
                  auVar74 = vpermt2q_avx512vl(auVar72,auVar81,auVar73);
                  local_27c0[2] = auVar74._0_8_;
                  auVar74 = vpermd_avx2(auVar81,auVar71);
                  *(int *)(local_27c0 + 3) = auVar74._0_4_;
                  auVar72 = vpermt2q_avx512vl(auVar72,auVar79,auVar73);
                  local_27c0[4] = auVar72._0_8_;
                  auVar71 = vpermd_avx2(auVar79,auVar71);
                  *(int *)(local_27c0 + 5) = auVar71._0_4_;
                  local_27c0 = local_27c0 + 6;
                }
                else {
                  auVar77 = valignd_avx512vl(auVar76,auVar76,3);
                  auVar75 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar78 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar75,auVar78);
                  auVar75 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar79 = vpermt2d_avx512vl(auVar78,auVar75,auVar79);
                  auVar79 = vpermt2d_avx512vl(auVar79,auVar75,auVar81);
                  auVar75 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar74 = vpermt2d_avx512vl(auVar79,auVar75,auVar74);
                  auVar109 = ZEXT3264(auVar74);
                  bVar50 = bVar43;
                  do {
                    auVar75 = auVar109._0_32_;
                    auVar120._8_4_ = 1;
                    auVar120._0_8_ = 0x100000001;
                    auVar120._12_4_ = 1;
                    auVar120._16_4_ = 1;
                    auVar120._20_4_ = 1;
                    auVar120._24_4_ = 1;
                    auVar120._28_4_ = 1;
                    auVar74 = vpermd_avx2(auVar120,auVar77);
                    auVar77 = valignd_avx512vl(auVar77,auVar77,1);
                    vpermt2q_avx512vl(auVar72,auVar77,auVar73);
                    bVar50 = bVar50 - 1 & bVar50;
                    uVar127 = vpcmpd_avx512vl(auVar74,auVar75,5);
                    auVar74 = vpmaxsd_avx2(auVar74,auVar75);
                    bVar44 = (byte)uVar127 << 1;
                    auVar75 = valignd_avx512vl(auVar75,auVar75,7);
                    bVar21 = (bool)((byte)uVar127 & 1);
                    auVar80._4_4_ = (uint)bVar21 * auVar75._4_4_ | (uint)!bVar21 * auVar74._4_4_;
                    auVar80._0_4_ = auVar74._0_4_;
                    bVar21 = (bool)(bVar44 >> 2 & 1);
                    auVar80._8_4_ = (uint)bVar21 * auVar75._8_4_ | (uint)!bVar21 * auVar74._8_4_;
                    bVar21 = (bool)(bVar44 >> 3 & 1);
                    auVar80._12_4_ = (uint)bVar21 * auVar75._12_4_ | (uint)!bVar21 * auVar74._12_4_;
                    bVar21 = (bool)(bVar44 >> 4 & 1);
                    auVar80._16_4_ = (uint)bVar21 * auVar75._16_4_ | (uint)!bVar21 * auVar74._16_4_;
                    bVar21 = (bool)(bVar44 >> 5 & 1);
                    auVar80._20_4_ = (uint)bVar21 * auVar75._20_4_ | (uint)!bVar21 * auVar74._20_4_;
                    bVar21 = (bool)(bVar44 >> 6 & 1);
                    auVar80._24_4_ = (uint)bVar21 * auVar75._24_4_ | (uint)!bVar21 * auVar74._24_4_;
                    auVar80._28_4_ =
                         (uint)(bVar44 >> 7) * auVar75._28_4_ |
                         (uint)!(bool)(bVar44 >> 7) * auVar74._28_4_;
                    auVar109 = ZEXT3264(auVar80);
                  } while (bVar50 != 0);
                  lVar47 = (ulong)(uint)POPCOUNT((uint)bVar43) + 3;
                  do {
                    auVar74 = vpermi2q_avx512vl(auVar80,auVar72,auVar73);
                    *local_27c0 = auVar74._0_8_;
                    auVar75 = auVar109._0_32_;
                    auVar74 = vpermd_avx2(auVar75,auVar71);
                    *(int *)(local_27c0 + 1) = auVar74._0_4_;
                    auVar80 = valignd_avx512vl(auVar75,auVar75,1);
                    local_27c0 = local_27c0 + 2;
                    auVar109 = ZEXT3264(auVar80);
                    lVar47 = lVar47 + -1;
                  } while (lVar47 != 0);
                  auVar71 = vpermt2q_avx512vl(auVar72,auVar80,auVar73);
                  uVar62 = auVar71._0_8_;
                }
                auVar129 = ZEXT3264(local_2680);
                auVar128 = ZEXT3264(local_26e0);
                auVar132 = ZEXT3264(auVar132._0_32_);
                auVar136 = ZEXT3264(auVar136._0_32_);
                auVar131 = ZEXT3264(auVar131._0_32_);
                auVar139 = ZEXT3264(auVar139._0_32_);
                auVar71 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar149 = ZEXT3264(auVar71);
                context = local_27a8;
                uVar56 = local_2798;
                ray = local_27b0;
                uVar48 = local_2770;
                uVar58 = local_2778;
                uVar59 = local_2780;
                uVar60 = local_2788;
                uVar61 = local_2790;
              }
            }
          }
        }
        local_2740 = (ulong)((uint)uVar62 & 0xf) - 8;
        if (local_2740 != 0) {
          uVar62 = uVar62 & 0xfffffffffffffff0;
          local_2738 = 0;
          local_23e0 = auVar148._0_32_;
          do {
            local_2750 = local_2738 * 0xe0;
            fVar22 = ((ray->super_RayK<1>).dir.field_0.m128[3] -
                     *(float *)(uVar62 + 0xd0 + local_2750)) *
                     *(float *)(uVar62 + 0xd4 + local_2750);
            auVar110._8_8_ = 0;
            auVar110._0_8_ = *(ulong *)(uVar62 + 0x40 + local_2750);
            auVar116._8_8_ = 0;
            auVar116._0_8_ = *(ulong *)(uVar62 + 0x48 + local_2750);
            uVar127 = vpcmpub_avx512vl(auVar110,auVar116,2);
            auVar71 = vpmovzxbd_avx2(auVar110);
            uVar115 = *(undefined4 *)(uVar62 + 0x7c + local_2750);
            auVar77._4_4_ = uVar115;
            auVar77._0_4_ = uVar115;
            auVar77._8_4_ = uVar115;
            auVar77._12_4_ = uVar115;
            auVar77._16_4_ = uVar115;
            auVar77._20_4_ = uVar115;
            auVar77._24_4_ = uVar115;
            auVar77._28_4_ = uVar115;
            auVar71 = vcvtdq2ps_avx(auVar71);
            uVar115 = *(undefined4 *)(uVar62 + 0x70 + local_2750);
            auVar83._4_4_ = uVar115;
            auVar83._0_4_ = uVar115;
            auVar83._8_4_ = uVar115;
            auVar83._12_4_ = uVar115;
            auVar83._16_4_ = uVar115;
            auVar83._20_4_ = uVar115;
            auVar83._24_4_ = uVar115;
            auVar83._28_4_ = uVar115;
            auVar65 = vfmadd213ps_fma(auVar71,auVar77,auVar83);
            auVar70._8_8_ = 0;
            auVar70._0_8_ = *(ulong *)(uVar62 + 0x88 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar70);
            auVar71 = vcvtdq2ps_avx(auVar71);
            uVar115 = *(undefined4 *)(uVar62 + 0xc4 + local_2750);
            auVar86._4_4_ = uVar115;
            auVar86._0_4_ = uVar115;
            auVar86._8_4_ = uVar115;
            auVar86._12_4_ = uVar115;
            auVar86._16_4_ = uVar115;
            auVar86._20_4_ = uVar115;
            auVar86._24_4_ = uVar115;
            auVar86._28_4_ = uVar115;
            uVar115 = *(undefined4 *)(uVar62 + 0xb8 + local_2750);
            auVar87._4_4_ = uVar115;
            auVar87._0_4_ = uVar115;
            auVar87._8_4_ = uVar115;
            auVar87._12_4_ = uVar115;
            auVar87._16_4_ = uVar115;
            auVar87._20_4_ = uVar115;
            auVar87._24_4_ = uVar115;
            auVar87._28_4_ = uVar115;
            auVar70 = vfmadd213ps_fma(auVar71,auVar86,auVar87);
            auVar78._4_4_ = fVar22;
            auVar78._0_4_ = fVar22;
            auVar78._8_4_ = fVar22;
            auVar78._12_4_ = fVar22;
            auVar78._16_4_ = fVar22;
            auVar78._20_4_ = fVar22;
            auVar78._24_4_ = fVar22;
            auVar78._28_4_ = fVar22;
            auVar71 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar65));
            auVar65 = vfmadd213ps_fma(auVar71,auVar78,ZEXT1632(auVar65));
            auVar71 = vpmovzxbd_avx2(auVar116);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar70 = vfmadd213ps_fma(auVar71,auVar77,auVar83);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(uVar62 + 0x90 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar3);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar66 = vfmadd213ps_fma(auVar71,auVar86,auVar87);
            auVar71 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar70));
            auVar70 = vfmadd213ps_fma(auVar71,auVar78,ZEXT1632(auVar70));
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)(uVar62 + 0x50 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar4);
            uVar115 = *(undefined4 *)(uVar62 + 0x80 + local_2750);
            auVar82._4_4_ = uVar115;
            auVar82._0_4_ = uVar115;
            auVar82._8_4_ = uVar115;
            auVar82._12_4_ = uVar115;
            auVar82._16_4_ = uVar115;
            auVar82._20_4_ = uVar115;
            auVar82._24_4_ = uVar115;
            auVar82._28_4_ = uVar115;
            uVar115 = *(undefined4 *)(uVar62 + 0x74 + local_2750);
            auVar84._4_4_ = uVar115;
            auVar84._0_4_ = uVar115;
            auVar84._8_4_ = uVar115;
            auVar84._12_4_ = uVar115;
            auVar84._16_4_ = uVar115;
            auVar84._20_4_ = uVar115;
            auVar84._24_4_ = uVar115;
            auVar84._28_4_ = uVar115;
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar66 = vfmadd213ps_fma(auVar71,auVar82,auVar84);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(uVar62 + 0x98 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar5);
            uVar115 = *(undefined4 *)(uVar62 + 200 + local_2750);
            auVar88._4_4_ = uVar115;
            auVar88._0_4_ = uVar115;
            auVar88._8_4_ = uVar115;
            auVar88._12_4_ = uVar115;
            auVar88._16_4_ = uVar115;
            auVar88._20_4_ = uVar115;
            auVar88._24_4_ = uVar115;
            auVar88._28_4_ = uVar115;
            auVar71 = vcvtdq2ps_avx(auVar71);
            uVar115 = *(undefined4 *)(uVar62 + 0xbc + local_2750);
            auVar90._4_4_ = uVar115;
            auVar90._0_4_ = uVar115;
            auVar90._8_4_ = uVar115;
            auVar90._12_4_ = uVar115;
            auVar90._16_4_ = uVar115;
            auVar90._20_4_ = uVar115;
            auVar90._24_4_ = uVar115;
            auVar90._28_4_ = uVar115;
            auVar23 = vfmadd213ps_fma(auVar71,auVar88,auVar90);
            auVar71 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar66));
            auVar66 = vfmadd213ps_fma(auVar71,auVar78,ZEXT1632(auVar66));
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)(uVar62 + 0x58 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar6);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar23 = vfmadd213ps_fma(auVar71,auVar82,auVar84);
            auVar7._8_8_ = 0;
            auVar7._0_8_ = *(ulong *)(uVar62 + 0xa0 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar7);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar69 = vfmadd213ps_fma(auVar71,auVar88,auVar90);
            auVar71 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar23));
            auVar23 = vfmadd213ps_fma(auVar71,auVar78,ZEXT1632(auVar23));
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(uVar62 + 0x60 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar8);
            auVar71 = vcvtdq2ps_avx(auVar71);
            uVar115 = *(undefined4 *)(uVar62 + 0x84 + local_2750);
            auVar85._4_4_ = uVar115;
            auVar85._0_4_ = uVar115;
            auVar85._8_4_ = uVar115;
            auVar85._12_4_ = uVar115;
            auVar85._16_4_ = uVar115;
            auVar85._20_4_ = uVar115;
            auVar85._24_4_ = uVar115;
            auVar85._28_4_ = uVar115;
            uVar115 = *(undefined4 *)(uVar62 + 0x78 + local_2750);
            auVar89._4_4_ = uVar115;
            auVar89._0_4_ = uVar115;
            auVar89._8_4_ = uVar115;
            auVar89._12_4_ = uVar115;
            auVar89._16_4_ = uVar115;
            auVar89._20_4_ = uVar115;
            auVar89._24_4_ = uVar115;
            auVar89._28_4_ = uVar115;
            auVar69 = vfmadd213ps_fma(auVar71,auVar85,auVar89);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(uVar62 + 0xa8 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar9);
            uVar115 = *(undefined4 *)(uVar62 + 0xcc + local_2750);
            auVar91._4_4_ = uVar115;
            auVar91._0_4_ = uVar115;
            auVar91._8_4_ = uVar115;
            auVar91._12_4_ = uVar115;
            auVar91._16_4_ = uVar115;
            auVar91._20_4_ = uVar115;
            auVar91._24_4_ = uVar115;
            auVar91._28_4_ = uVar115;
            uVar115 = *(undefined4 *)(uVar62 + 0xc0 + local_2750);
            auVar92._4_4_ = uVar115;
            auVar92._0_4_ = uVar115;
            auVar92._8_4_ = uVar115;
            auVar92._12_4_ = uVar115;
            auVar92._16_4_ = uVar115;
            auVar92._20_4_ = uVar115;
            auVar92._24_4_ = uVar115;
            auVar92._28_4_ = uVar115;
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar67 = vfmadd213ps_fma(auVar71,auVar91,auVar92);
            auVar71 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar69));
            auVar69 = vfmadd213ps_fma(auVar71,auVar78,ZEXT1632(auVar69));
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(uVar62 + 0x68 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar10);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar67 = vfmadd213ps_fma(auVar71,auVar85,auVar89);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(uVar62 + 0xb0 + local_2750);
            auVar71 = vpmovzxbd_avx2(auVar11);
            auVar71 = vcvtdq2ps_avx(auVar71);
            auVar68 = vfmadd213ps_fma(auVar71,auVar91,auVar92);
            auVar71 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar67));
            auVar67 = vfmadd213ps_fma(auVar71,auVar78,ZEXT1632(auVar67));
            auVar71 = vsubps_avx(ZEXT1632(auVar65),local_2680);
            auVar73._4_4_ = auVar71._4_4_ * (float)local_25e0._4_4_;
            auVar73._0_4_ = auVar71._0_4_ * (float)local_25e0._0_4_;
            auVar73._8_4_ = auVar71._8_4_ * fStack_25d8;
            auVar73._12_4_ = auVar71._12_4_ * fStack_25d4;
            auVar73._16_4_ = auVar71._16_4_ * fStack_25d0;
            auVar73._20_4_ = auVar71._20_4_ * fStack_25cc;
            auVar73._24_4_ = auVar71._24_4_ * fStack_25c8;
            auVar73._28_4_ = auVar71._28_4_;
            auVar71 = vsubps_avx(ZEXT1632(auVar66),local_26e0);
            auVar74._4_4_ = auVar71._4_4_ * (float)local_2600._4_4_;
            auVar74._0_4_ = auVar71._0_4_ * (float)local_2600._0_4_;
            auVar74._8_4_ = auVar71._8_4_ * fStack_25f8;
            auVar74._12_4_ = auVar71._12_4_ * fStack_25f4;
            auVar74._16_4_ = auVar71._16_4_ * fStack_25f0;
            auVar74._20_4_ = auVar71._20_4_ * fStack_25ec;
            auVar74._24_4_ = auVar71._24_4_ * fStack_25e8;
            auVar74._28_4_ = auVar71._28_4_;
            auVar71 = vsubps_avx(ZEXT1632(auVar69),auVar140._0_32_);
            auVar75._4_4_ = auVar71._4_4_ * (float)local_2620._4_4_;
            auVar75._0_4_ = auVar71._0_4_ * (float)local_2620._0_4_;
            auVar75._8_4_ = auVar71._8_4_ * fStack_2618;
            auVar75._12_4_ = auVar71._12_4_ * fStack_2614;
            auVar75._16_4_ = auVar71._16_4_ * fStack_2610;
            auVar75._20_4_ = auVar71._20_4_ * fStack_260c;
            auVar75._24_4_ = auVar71._24_4_ * fStack_2608;
            auVar75._28_4_ = auVar71._28_4_;
            auVar71 = vsubps_avx(ZEXT1632(auVar70),local_2680);
            auVar79._4_4_ = fVar118 * auVar71._4_4_;
            auVar79._0_4_ = fVar104 * auVar71._0_4_;
            auVar79._8_4_ = fVar64 * auVar71._8_4_;
            auVar79._12_4_ = fVar100 * auVar71._12_4_;
            auVar79._16_4_ = fVar101 * auVar71._16_4_;
            auVar79._20_4_ = fVar102 * auVar71._20_4_;
            auVar79._24_4_ = fVar103 * auVar71._24_4_;
            auVar79._28_4_ = auVar71._28_4_;
            auVar71 = vsubps_avx(ZEXT1632(auVar23),local_26e0);
            auVar81._4_4_ = auVar146._4_4_ * auVar71._4_4_;
            auVar81._0_4_ = auVar146._0_4_ * auVar71._0_4_;
            auVar81._8_4_ = auVar146._8_4_ * auVar71._8_4_;
            auVar81._12_4_ = auVar146._12_4_ * auVar71._12_4_;
            auVar81._16_4_ = auVar146._16_4_ * auVar71._16_4_;
            auVar81._20_4_ = auVar146._20_4_ * auVar71._20_4_;
            auVar81._24_4_ = auVar146._24_4_ * auVar71._24_4_;
            auVar81._28_4_ = auVar71._28_4_;
            auVar71 = vsubps_avx(ZEXT1632(auVar67),auVar140._0_32_);
            auVar78 = vmulps_avx512vl(auVar147._0_32_,auVar71);
            auVar72 = vpminsd_avx2(auVar73,auVar79);
            auVar71 = vpmaxsd_avx2(auVar73,auVar79);
            auVar73 = vpminsd_avx2(auVar74,auVar81);
            auVar72 = vpmaxsd_avx2(auVar72,auVar73);
            auVar73 = vpmaxsd_avx2(auVar74,auVar81);
            auVar74 = vpminsd_avx2(auVar71,auVar73);
            auVar73 = vpminsd_avx2(auVar75,auVar78);
            auVar71 = vpmaxsd_avx2(auVar75,auVar78);
            auVar73 = vpmaxsd_avx2(auVar73,auVar144._0_32_);
            local_23c0 = vpmaxsd_avx2(auVar72,auVar73);
            auVar71 = vpminsd_avx512vl(auVar71,auVar148._0_32_);
            auVar71 = vpminsd_avx2(auVar74,auVar71);
            uVar26 = vpcmpd_avx512vl(local_23c0,auVar71,2);
            if ((byte)((byte)uVar26 & (byte)uVar127) != 0) {
              local_2750 = local_2750 + uVar62;
              local_2718 = (ulong)(byte)((byte)uVar26 & (byte)uVar127);
              do {
                lVar47 = 0;
                for (uVar63 = local_2718; (uVar63 & 1) == 0;
                    uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                  lVar47 = lVar47 + 1;
                }
                fVar22 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_23c0 + lVar47 * 4) <= fVar22) {
                  uVar12 = *(ushort *)(local_2750 + lVar47 * 8);
                  uVar13 = *(ushort *)(local_2750 + 2 + lVar47 * 8);
                  local_2758 = (uint)uVar13;
                  uVar14 = *(uint *)(local_2750 + 0xd8);
                  local_2768 = (ulong)uVar14;
                  uVar52 = *(uint *)(local_2750 + 4 + lVar47 * 8);
                  local_2720 = context->scene;
                  pGVar15 = (local_2720->geometries).items[local_2768].ptr;
                  local_2728 = *(long *)&pGVar15->field_0x58;
                  local_2748 = (ulong)uVar52;
                  local_2730 = pGVar15[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar52;
                  fVar118 = (pGVar15->time_range).lower;
                  fVar118 = pGVar15->fnumTimeSegments *
                            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar118) /
                            ((pGVar15->time_range).upper - fVar118));
                  auVar65 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
                  auVar65 = vminss_avx(auVar65,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
                  auVar68 = vmaxss_avx(ZEXT816(0) << 0x20,auVar65);
                  local_275c = uVar12 & 0x7fff;
                  local_2760 = local_2758 & 0x7fff;
                  uVar45 = *(uint *)(local_2728 + 4 + local_2730);
                  uVar58 = (ulong)uVar45;
                  uVar48 = (ulong)(uVar45 * local_2760 +
                                  *(int *)(local_2728 + local_2730) + local_275c);
                  lVar16 = *(long *)&pGVar15[2].numPrimitives;
                  local_2640._0_8_ = lVar16;
                  lVar53 = (long)(int)auVar68._0_4_ * 0x38;
                  lVar17 = *(long *)(lVar16 + 0x10 + lVar53);
                  lVar18 = *(long *)(lVar16 + lVar53);
                  auVar65 = *(undefined1 (*) [16])(lVar18 + lVar17 * uVar48);
                  lVar19 = *(long *)(lVar16 + 0x48 + lVar53);
                  lVar54 = lVar19 * (uVar48 + 1);
                  local_2660._0_8_ = lVar54;
                  auVar70 = *(undefined1 (*) [16])(lVar18 + (uVar48 + 1) * lVar17);
                  lVar47 = uVar48 + uVar58;
                  auVar66 = *(undefined1 (*) [16])(lVar18 + lVar47 * lVar17);
                  lVar55 = uVar48 + uVar58 + 1;
                  auVar23 = *(undefined1 (*) [16])(lVar18 + lVar55 * lVar17);
                  uVar56 = (ulong)(-1 < (short)uVar12);
                  lVar49 = uVar48 + uVar56 + 1;
                  auVar69 = *(undefined1 (*) [16])(lVar18 + lVar49 * lVar17);
                  lVar57 = uVar56 + lVar55;
                  auVar67 = *(undefined1 (*) [16])(lVar18 + lVar57 * lVar17);
                  uVar56 = 0;
                  if (-1 < (short)uVar13) {
                    uVar56 = uVar58;
                  }
                  auVar3 = *(undefined1 (*) [16])(lVar18 + (lVar47 + uVar56) * lVar17);
                  auVar4 = *(undefined1 (*) [16])(lVar18 + (lVar55 + uVar56) * lVar17);
                  auVar5 = *(undefined1 (*) [16])(lVar18 + lVar17 * (uVar56 + lVar57));
                  lVar16 = *(long *)(lVar16 + 0x38 + lVar53);
                  fVar118 = fVar118 - auVar68._0_4_;
                  auVar111._4_4_ = fVar118;
                  auVar111._0_4_ = fVar118;
                  auVar111._8_4_ = fVar118;
                  auVar111._12_4_ = fVar118;
                  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar16 + lVar19 * uVar48),auVar65);
                  auVar6 = vfmadd213ps_fma(auVar68,auVar111,auVar65);
                  auVar65 = vsubps_avx(*(undefined1 (*) [16])(lVar16 + lVar54),auVar70);
                  auVar7 = vfmadd213ps_fma(auVar65,auVar111,auVar70);
                  auVar65 = vsubps_avx(*(undefined1 (*) [16])(lVar16 + lVar19 * lVar47),auVar66);
                  auVar8 = vfmadd213ps_fma(auVar65,auVar111,auVar66);
                  auVar65 = vsubps_avx(*(undefined1 (*) [16])(lVar16 + lVar19 * lVar55),auVar23);
                  auVar9 = vfmadd213ps_fma(auVar65,auVar111,auVar23);
                  auVar65 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar16 + lVar19 * lVar49),auVar69
                                           );
                  auVar70 = vfmadd213ps_fma(auVar65,auVar111,auVar69);
                  auVar65 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar16 + lVar19 * lVar57),auVar67
                                           );
                  auVar10 = vfmadd213ps_fma(auVar65,auVar111,auVar67);
                  auVar65 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar16 + lVar19 * (lVar47 + uVar56)),auVar3);
                  auVar3 = vfmadd213ps_fma(auVar65,auVar111,auVar3);
                  auVar65 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar16 + lVar19 * (lVar55 + uVar56)),auVar4);
                  auVar4 = vfmadd213ps_fma(auVar65,auVar111,auVar4);
                  auVar65 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar16 + (uVar56 + lVar57) * lVar19),auVar5);
                  auVar5 = vfmadd213ps_fma(auVar65,auVar111,auVar5);
                  auVar66 = vunpcklps_avx(auVar7,auVar10);
                  auVar65 = vunpckhps_avx(auVar7,auVar10);
                  auVar23 = vunpcklps_avx(auVar70,auVar9);
                  auVar70 = vunpckhps_avx(auVar70,auVar9);
                  auVar69 = vunpcklps_avx(auVar65,auVar70);
                  auVar67 = vunpcklps_avx(auVar66,auVar23);
                  auVar65 = vunpckhps_avx(auVar66,auVar23);
                  auVar23 = vunpcklps_avx(auVar8,auVar4);
                  auVar70 = vunpckhps_avx(auVar8,auVar4);
                  auVar68 = vunpcklps_avx(auVar9,auVar3);
                  auVar66 = vunpckhps_avx(auVar9,auVar3);
                  auVar66 = vunpcklps_avx(auVar70,auVar66);
                  auVar3 = vunpcklps_avx(auVar23,auVar68);
                  auVar70 = vunpckhps_avx(auVar23,auVar68);
                  auVar124._16_16_ = auVar4;
                  auVar124._0_16_ = auVar8;
                  auVar121._16_16_ = auVar10;
                  auVar121._0_16_ = auVar7;
                  auVar71 = vunpcklps_avx(auVar121,auVar124);
                  auVar133._16_16_ = auVar5;
                  auVar133._0_16_ = auVar9;
                  auVar117._16_16_ = auVar9;
                  auVar117._0_16_ = auVar6;
                  auVar72 = vunpcklps_avx(auVar117,auVar133);
                  auVar74 = vunpcklps_avx(auVar72,auVar71);
                  auVar72 = vunpckhps_avx(auVar72,auVar71);
                  auVar71 = vunpckhps_avx(auVar121,auVar124);
                  auVar73 = vunpckhps_avx(auVar117,auVar133);
                  auVar73 = vunpcklps_avx(auVar73,auVar71);
                  auVar122._16_16_ = auVar67;
                  auVar122._0_16_ = auVar67;
                  auVar113._16_16_ = auVar65;
                  auVar113._0_16_ = auVar65;
                  auVar125._16_16_ = auVar69;
                  auVar125._0_16_ = auVar69;
                  auVar134._16_16_ = auVar3;
                  auVar134._0_16_ = auVar3;
                  auVar142._16_16_ = auVar70;
                  auVar142._0_16_ = auVar70;
                  uVar115 = *(undefined4 *)&(local_27b0->super_RayK<1>).org.field_0;
                  auVar145._4_4_ = uVar115;
                  auVar145._0_4_ = uVar115;
                  auVar145._8_4_ = uVar115;
                  auVar145._12_4_ = uVar115;
                  auVar145._16_4_ = uVar115;
                  auVar145._20_4_ = uVar115;
                  auVar145._24_4_ = uVar115;
                  auVar145._28_4_ = uVar115;
                  auVar75 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(local_27b0->super_RayK<1>).org.field_0.m128[1]
                                              ));
                  auVar79 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(local_27b0->super_RayK<1>).org.field_0.m128[2]
                                              ));
                  uVar115 = *(undefined4 *)&(local_27b0->super_RayK<1>).dir.field_0;
                  auVar130._4_4_ = uVar115;
                  auVar130._0_4_ = uVar115;
                  auVar130._8_4_ = uVar115;
                  auVar130._12_4_ = uVar115;
                  auVar130._16_4_ = uVar115;
                  auVar130._20_4_ = uVar115;
                  auVar130._24_4_ = uVar115;
                  auVar130._28_4_ = uVar115;
                  auVar81 = vinsertf32x4_avx512vl(ZEXT1632(auVar66),auVar66,1);
                  uVar115 = *(undefined4 *)((long)&(local_27b0->super_RayK<1>).dir.field_0 + 4);
                  auVar137._4_4_ = uVar115;
                  auVar137._0_4_ = uVar115;
                  auVar137._8_4_ = uVar115;
                  auVar137._12_4_ = uVar115;
                  auVar137._16_4_ = uVar115;
                  auVar137._20_4_ = uVar115;
                  auVar137._24_4_ = uVar115;
                  auVar137._28_4_ = uVar115;
                  fVar118 = (local_27b0->super_RayK<1>).dir.field_0.m128[2];
                  auVar141._4_4_ = fVar118;
                  auVar141._0_4_ = fVar118;
                  auVar141._8_4_ = fVar118;
                  auVar141._12_4_ = fVar118;
                  auVar141._16_4_ = fVar118;
                  auVar141._20_4_ = fVar118;
                  auVar141._24_4_ = fVar118;
                  auVar141._28_4_ = fVar118;
                  auVar71 = vsubps_avx(auVar74,auVar145);
                  auVar74 = vsubps_avx512vl(auVar72,auVar75);
                  auVar73 = vsubps_avx512vl(auVar73,auVar79);
                  auVar72 = vsubps_avx(auVar122,auVar145);
                  auVar78 = vsubps_avx512vl(auVar113,auVar75);
                  auVar77 = vsubps_avx512vl(auVar125,auVar79);
                  auVar82 = vsubps_avx512vl(auVar134,auVar145);
                  auVar75 = vsubps_avx512vl(auVar142,auVar75);
                  auVar79 = vsubps_avx512vl(auVar81,auVar79);
                  auVar81 = vsubps_avx512vl(auVar82,auVar71);
                  auVar83 = vsubps_avx512vl(auVar75,auVar74);
                  auVar84 = vsubps_avx512vl(auVar79,auVar73);
                  auVar85 = vsubps_avx512vl(auVar71,auVar72);
                  auVar86 = vsubps_avx512vl(auVar74,auVar78);
                  auVar87 = vsubps_avx512vl(auVar73,auVar77);
                  auVar88 = vsubps_avx512vl(auVar72,auVar82);
                  auVar89 = vsubps_avx512vl(auVar78,auVar75);
                  auVar90 = vsubps_avx512vl(auVar77,auVar79);
                  auVar91 = vaddps_avx512vl(auVar82,auVar71);
                  auVar92 = vaddps_avx512vl(auVar75,auVar74);
                  auVar93 = vaddps_avx512vl(auVar79,auVar73);
                  auVar94 = vmulps_avx512vl(auVar92,auVar84);
                  auVar94 = vfmsub231ps_avx512vl(auVar94,auVar83,auVar93);
                  auVar93 = vmulps_avx512vl(auVar93,auVar81);
                  auVar93 = vfmsub231ps_avx512vl(auVar93,auVar84,auVar91);
                  auVar91 = vmulps_avx512vl(auVar91,auVar83);
                  auVar65 = vfmsub231ps_fma(auVar91,auVar81,auVar92);
                  auVar135._0_4_ = fVar118 * auVar65._0_4_;
                  auVar135._4_4_ = fVar118 * auVar65._4_4_;
                  auVar135._8_4_ = fVar118 * auVar65._8_4_;
                  auVar135._12_4_ = fVar118 * auVar65._12_4_;
                  auVar135._16_4_ = fVar118 * 0.0;
                  auVar135._20_4_ = fVar118 * 0.0;
                  auVar135._24_4_ = fVar118 * 0.0;
                  auVar135._28_4_ = 0;
                  auVar91 = vfmadd231ps_avx512vl(auVar135,auVar137,auVar93);
                  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar130,auVar94);
                  auVar143._0_4_ = auVar71._0_4_ + auVar72._0_4_;
                  auVar143._4_4_ = auVar71._4_4_ + auVar72._4_4_;
                  auVar143._8_4_ = auVar71._8_4_ + auVar72._8_4_;
                  auVar143._12_4_ = auVar71._12_4_ + auVar72._12_4_;
                  auVar143._16_4_ = auVar71._16_4_ + auVar72._16_4_;
                  auVar143._20_4_ = auVar71._20_4_ + auVar72._20_4_;
                  auVar143._24_4_ = auVar71._24_4_ + auVar72._24_4_;
                  auVar143._28_4_ = auVar71._28_4_ + auVar72._28_4_;
                  auVar92 = vaddps_avx512vl(auVar74,auVar78);
                  auVar93 = vaddps_avx512vl(auVar73,auVar77);
                  auVar94 = vmulps_avx512vl(auVar92,auVar87);
                  auVar94 = vfmsub231ps_avx512vl(auVar94,auVar86,auVar93);
                  auVar93 = vmulps_avx512vl(auVar93,auVar85);
                  auVar93 = vfmsub231ps_avx512vl(auVar93,auVar87,auVar143);
                  auVar95 = vmulps_avx512vl(auVar143,auVar86);
                  auVar92 = vfmsub231ps_avx512vl(auVar95,auVar85,auVar92);
                  auVar37._4_4_ = fVar118 * auVar92._4_4_;
                  auVar37._0_4_ = fVar118 * auVar92._0_4_;
                  auVar37._8_4_ = fVar118 * auVar92._8_4_;
                  auVar37._12_4_ = fVar118 * auVar92._12_4_;
                  auVar37._16_4_ = fVar118 * auVar92._16_4_;
                  auVar37._20_4_ = fVar118 * auVar92._20_4_;
                  auVar37._24_4_ = fVar118 * auVar92._24_4_;
                  auVar37._28_4_ = auVar92._28_4_;
                  auVar92 = vfmadd231ps_avx512vl(auVar37,auVar137,auVar93);
                  auVar92 = vfmadd231ps_avx512vl(auVar92,auVar130,auVar94);
                  auVar72 = vaddps_avx512vl(auVar72,auVar82);
                  auVar75 = vaddps_avx512vl(auVar78,auVar75);
                  auVar79 = vaddps_avx512vl(auVar77,auVar79);
                  auVar78 = vmulps_avx512vl(auVar75,auVar90);
                  auVar78 = vfmsub231ps_avx512vl(auVar78,auVar89,auVar79);
                  auVar79 = vmulps_avx512vl(auVar79,auVar88);
                  auVar79 = vfmsub231ps_avx512vl(auVar79,auVar90,auVar72);
                  auVar38._4_4_ = auVar72._4_4_ * auVar89._4_4_;
                  auVar38._0_4_ = auVar72._0_4_ * auVar89._0_4_;
                  auVar38._8_4_ = auVar72._8_4_ * auVar89._8_4_;
                  auVar38._12_4_ = auVar72._12_4_ * auVar89._12_4_;
                  auVar38._16_4_ = auVar72._16_4_ * auVar89._16_4_;
                  auVar38._20_4_ = auVar72._20_4_ * auVar89._20_4_;
                  auVar38._24_4_ = auVar72._24_4_ * auVar89._24_4_;
                  auVar38._28_4_ = auVar72._28_4_;
                  auVar65 = vfmsub231ps_fma(auVar38,auVar88,auVar75);
                  auVar72 = vmulps_avx512vl(auVar141,ZEXT1632(auVar65));
                  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar137,auVar79);
                  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar130,auVar78);
                  auVar114._0_4_ = auVar91._0_4_ + auVar92._0_4_;
                  auVar114._4_4_ = auVar91._4_4_ + auVar92._4_4_;
                  auVar114._8_4_ = auVar91._8_4_ + auVar92._8_4_;
                  auVar114._12_4_ = auVar91._12_4_ + auVar92._12_4_;
                  auVar114._16_4_ = auVar91._16_4_ + auVar92._16_4_;
                  auVar114._20_4_ = auVar91._20_4_ + auVar92._20_4_;
                  auVar114._24_4_ = auVar91._24_4_ + auVar92._24_4_;
                  auVar114._28_4_ = auVar91._28_4_ + auVar92._28_4_;
                  local_2580 = vaddps_avx512vl(auVar72,auVar114);
                  auVar93._8_4_ = 0x7fffffff;
                  auVar93._0_8_ = 0x7fffffff7fffffff;
                  auVar93._12_4_ = 0x7fffffff;
                  auVar93._16_4_ = 0x7fffffff;
                  auVar93._20_4_ = 0x7fffffff;
                  auVar93._24_4_ = 0x7fffffff;
                  auVar93._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_2580,auVar93);
                  auVar94._8_4_ = 0x34000000;
                  auVar94._0_8_ = 0x3400000034000000;
                  auVar94._12_4_ = 0x34000000;
                  auVar94._16_4_ = 0x34000000;
                  auVar94._20_4_ = 0x34000000;
                  auVar94._24_4_ = 0x34000000;
                  auVar94._28_4_ = 0x34000000;
                  auVar75 = vmulps_avx512vl(local_2580,auVar94);
                  auVar79 = vminps_avx512vl(auVar91,auVar92);
                  auVar79 = vminps_avx512vl(auVar79,auVar72);
                  auVar95._8_4_ = 0x80000000;
                  auVar95._0_8_ = 0x8000000080000000;
                  auVar95._12_4_ = 0x80000000;
                  auVar95._16_4_ = 0x80000000;
                  auVar95._20_4_ = 0x80000000;
                  auVar95._24_4_ = 0x80000000;
                  auVar95._28_4_ = 0x80000000;
                  auVar78 = vxorps_avx512vl(auVar75,auVar95);
                  uVar127 = vcmpps_avx512vl(auVar79,auVar78,5);
                  auVar79 = vmaxps_avx512vl(auVar91,auVar92);
                  auVar72 = vmaxps_avx512vl(auVar79,auVar72);
                  uVar26 = vcmpps_avx512vl(auVar72,auVar75,2);
                  bVar43 = (byte)uVar127 | (byte)uVar26;
                  ray = local_27b0;
                  if (bVar43 != 0) {
                    auVar72 = vmulps_avx512vl(auVar84,auVar86);
                    auVar75 = vmulps_avx512vl(auVar81,auVar87);
                    auVar79 = vmulps_avx512vl(auVar83,auVar85);
                    auVar78 = vmulps_avx512vl(auVar87,auVar89);
                    auVar77 = vmulps_avx512vl(auVar85,auVar90);
                    auVar82 = vmulps_avx512vl(auVar86,auVar88);
                    auVar83 = vfmsub213ps_avx512vl(auVar83,auVar87,auVar72);
                    auVar84 = vfmsub213ps_avx512vl(auVar84,auVar85,auVar75);
                    auVar81 = vfmsub213ps_avx512vl(auVar81,auVar86,auVar79);
                    auVar86 = vfmsub213ps_avx512vl(auVar90,auVar86,auVar78);
                    auVar87 = vfmsub213ps_avx512vl(auVar88,auVar87,auVar77);
                    auVar85 = vfmsub213ps_avx512vl(auVar89,auVar85,auVar82);
                    auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    vandps_avx512vl(auVar72,auVar88);
                    vandps_avx512vl(auVar78,auVar88);
                    uVar56 = vcmpps_avx512vl(auVar88,auVar88,1);
                    vandps_avx512vl(auVar75,auVar88);
                    vandps_avx512vl(auVar77,auVar88);
                    uVar48 = vcmpps_avx512vl(auVar88,auVar88,1);
                    vandps_avx512vl(auVar79,auVar88);
                    vandps_avx512vl(auVar82,auVar88);
                    uVar58 = vcmpps_avx512vl(auVar88,auVar88,1);
                    bVar21 = (bool)((byte)uVar56 & 1);
                    auVar96._0_4_ =
                         (float)((uint)bVar21 * auVar83._0_4_ | (uint)!bVar21 * auVar86._0_4_);
                    bVar21 = (bool)((byte)(uVar56 >> 1) & 1);
                    auVar96._4_4_ =
                         (float)((uint)bVar21 * auVar83._4_4_ | (uint)!bVar21 * auVar86._4_4_);
                    bVar21 = (bool)((byte)(uVar56 >> 2) & 1);
                    auVar96._8_4_ =
                         (float)((uint)bVar21 * auVar83._8_4_ | (uint)!bVar21 * auVar86._8_4_);
                    bVar21 = (bool)((byte)(uVar56 >> 3) & 1);
                    auVar96._12_4_ =
                         (float)((uint)bVar21 * auVar83._12_4_ | (uint)!bVar21 * auVar86._12_4_);
                    bVar21 = (bool)((byte)(uVar56 >> 4) & 1);
                    auVar96._16_4_ =
                         (float)((uint)bVar21 * auVar83._16_4_ | (uint)!bVar21 * auVar86._16_4_);
                    bVar21 = (bool)((byte)(uVar56 >> 5) & 1);
                    auVar96._20_4_ =
                         (float)((uint)bVar21 * auVar83._20_4_ | (uint)!bVar21 * auVar86._20_4_);
                    bVar21 = (bool)((byte)(uVar56 >> 6) & 1);
                    auVar96._24_4_ =
                         (float)((uint)bVar21 * auVar83._24_4_ | (uint)!bVar21 * auVar86._24_4_);
                    bVar21 = SUB81(uVar56 >> 7,0);
                    auVar96._28_4_ = (uint)bVar21 * auVar83._28_4_ | (uint)!bVar21 * auVar86._28_4_;
                    bVar21 = (bool)((byte)uVar48 & 1);
                    auVar97._0_4_ =
                         (float)((uint)bVar21 * auVar84._0_4_ | (uint)!bVar21 * auVar87._0_4_);
                    bVar21 = (bool)((byte)(uVar48 >> 1) & 1);
                    auVar97._4_4_ =
                         (float)((uint)bVar21 * auVar84._4_4_ | (uint)!bVar21 * auVar87._4_4_);
                    bVar21 = (bool)((byte)(uVar48 >> 2) & 1);
                    auVar97._8_4_ =
                         (float)((uint)bVar21 * auVar84._8_4_ | (uint)!bVar21 * auVar87._8_4_);
                    bVar21 = (bool)((byte)(uVar48 >> 3) & 1);
                    auVar97._12_4_ =
                         (float)((uint)bVar21 * auVar84._12_4_ | (uint)!bVar21 * auVar87._12_4_);
                    bVar21 = (bool)((byte)(uVar48 >> 4) & 1);
                    auVar97._16_4_ =
                         (float)((uint)bVar21 * auVar84._16_4_ | (uint)!bVar21 * auVar87._16_4_);
                    bVar21 = (bool)((byte)(uVar48 >> 5) & 1);
                    auVar97._20_4_ =
                         (float)((uint)bVar21 * auVar84._20_4_ | (uint)!bVar21 * auVar87._20_4_);
                    bVar21 = (bool)((byte)(uVar48 >> 6) & 1);
                    auVar97._24_4_ =
                         (float)((uint)bVar21 * auVar84._24_4_ | (uint)!bVar21 * auVar87._24_4_);
                    bVar21 = SUB81(uVar48 >> 7,0);
                    auVar97._28_4_ = (uint)bVar21 * auVar84._28_4_ | (uint)!bVar21 * auVar87._28_4_;
                    bVar21 = (bool)((byte)uVar58 & 1);
                    fVar64 = (float)((uint)bVar21 * auVar81._0_4_ | (uint)!bVar21 * auVar85._0_4_);
                    bVar21 = (bool)((byte)(uVar58 >> 1) & 1);
                    fVar100 = (float)((uint)bVar21 * auVar81._4_4_ | (uint)!bVar21 * auVar85._4_4_);
                    bVar21 = (bool)((byte)(uVar58 >> 2) & 1);
                    fVar101 = (float)((uint)bVar21 * auVar81._8_4_ | (uint)!bVar21 * auVar85._8_4_);
                    bVar21 = (bool)((byte)(uVar58 >> 3) & 1);
                    fVar102 = (float)((uint)bVar21 * auVar81._12_4_ | (uint)!bVar21 * auVar85._12_4_
                                     );
                    bVar21 = (bool)((byte)(uVar58 >> 4) & 1);
                    fVar103 = (float)((uint)bVar21 * auVar81._16_4_ | (uint)!bVar21 * auVar85._16_4_
                                     );
                    bVar21 = (bool)((byte)(uVar58 >> 5) & 1);
                    fVar104 = (float)((uint)bVar21 * auVar81._20_4_ | (uint)!bVar21 * auVar85._20_4_
                                     );
                    bVar21 = (bool)((byte)(uVar58 >> 6) & 1);
                    fVar105 = (float)((uint)bVar21 * auVar81._24_4_ | (uint)!bVar21 * auVar85._24_4_
                                     );
                    bVar21 = SUB81(uVar58 >> 7,0);
                    auVar39._4_4_ = fVar118 * fVar100;
                    auVar39._0_4_ = fVar118 * fVar64;
                    auVar39._8_4_ = fVar118 * fVar101;
                    auVar39._12_4_ = fVar118 * fVar102;
                    auVar39._16_4_ = fVar118 * fVar103;
                    auVar39._20_4_ = fVar118 * fVar104;
                    auVar39._24_4_ = fVar118 * fVar105;
                    auVar39._28_4_ = fVar118;
                    auVar65 = vfmadd213ps_fma(auVar137,auVar97,auVar39);
                    auVar65 = vfmadd213ps_fma(auVar130,auVar96,ZEXT1632(auVar65));
                    auVar75 = ZEXT1632(CONCAT412(auVar65._12_4_ + auVar65._12_4_,
                                                 CONCAT48(auVar65._8_4_ + auVar65._8_4_,
                                                          CONCAT44(auVar65._4_4_ + auVar65._4_4_,
                                                                   auVar65._0_4_ + auVar65._0_4_))))
                    ;
                    auVar138._0_4_ = auVar73._0_4_ * fVar64;
                    auVar138._4_4_ = auVar73._4_4_ * fVar100;
                    auVar138._8_4_ = auVar73._8_4_ * fVar101;
                    auVar138._12_4_ = auVar73._12_4_ * fVar102;
                    auVar138._16_4_ = auVar73._16_4_ * fVar103;
                    auVar138._20_4_ = auVar73._20_4_ * fVar104;
                    auVar138._24_4_ = auVar73._24_4_ * fVar105;
                    auVar138._28_4_ = 0;
                    auVar65 = vfmadd213ps_fma(auVar74,auVar97,auVar138);
                    auVar70 = vfmadd213ps_fma(auVar71,auVar96,ZEXT1632(auVar65));
                    auVar71 = vrcp14ps_avx512vl(auVar75);
                    auVar27._8_4_ = 0x80000000;
                    auVar27._0_8_ = 0x8000000080000000;
                    auVar27._12_4_ = 0x80000000;
                    auVar27._16_4_ = 0x80000000;
                    auVar27._20_4_ = 0x80000000;
                    auVar27._24_4_ = 0x80000000;
                    auVar27._28_4_ = 0x80000000;
                    auVar72 = vxorps_avx512vl(auVar75,auVar27);
                    auVar28._8_4_ = 0x3f800000;
                    auVar28._0_8_ = 0x3f8000003f800000;
                    auVar28._12_4_ = 0x3f800000;
                    auVar28._16_4_ = 0x3f800000;
                    auVar28._20_4_ = 0x3f800000;
                    auVar28._24_4_ = 0x3f800000;
                    auVar28._28_4_ = 0x3f800000;
                    auVar73 = vfnmadd213ps_avx512vl(auVar71,auVar75,auVar28);
                    auVar65 = vfmadd132ps_fma(auVar73,auVar71,auVar71);
                    local_2500._28_4_ = auVar71._28_4_;
                    local_2500._0_28_ =
                         ZEXT1628(CONCAT412(auVar65._12_4_ * (auVar70._12_4_ + auVar70._12_4_),
                                            CONCAT48(auVar65._8_4_ * (auVar70._8_4_ + auVar70._8_4_)
                                                     ,CONCAT44(auVar65._4_4_ *
                                                               (auVar70._4_4_ + auVar70._4_4_),
                                                               auVar65._0_4_ *
                                                               (auVar70._0_4_ + auVar70._0_4_)))));
                    auVar109 = ZEXT3264(local_2500);
                    auVar106._4_4_ = fVar22;
                    auVar106._0_4_ = fVar22;
                    auVar106._8_4_ = fVar22;
                    auVar106._12_4_ = fVar22;
                    auVar106._16_4_ = fVar22;
                    auVar106._20_4_ = fVar22;
                    auVar106._24_4_ = fVar22;
                    auVar106._28_4_ = fVar22;
                    uVar127 = vcmpps_avx512vl(local_2500,auVar106,2);
                    uVar115 = *(undefined4 *)((long)&(local_27b0->super_RayK<1>).org.field_0 + 0xc);
                    auVar29._4_4_ = uVar115;
                    auVar29._0_4_ = uVar115;
                    auVar29._8_4_ = uVar115;
                    auVar29._12_4_ = uVar115;
                    auVar29._16_4_ = uVar115;
                    auVar29._20_4_ = uVar115;
                    auVar29._24_4_ = uVar115;
                    auVar29._28_4_ = uVar115;
                    uVar26 = vcmpps_avx512vl(local_2500,auVar29,0xd);
                    uVar25 = vcmpps_avx512vl(auVar75,auVar72,4);
                    bVar43 = (byte)uVar127 & (byte)uVar26 & (byte)uVar25 & bVar43;
                    if (bVar43 != 0) {
                      uVar45 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                                       ((long)&(local_27b0->super_RayK<1>).org.
                                                               field_0 + 0xc),0x10),2);
                      local_2560 = &local_27b1;
                      local_2558 = bVar43;
                      auVar71 = vsubps_avx(local_2580,auVar92);
                      auVar71 = vblendps_avx(auVar91,auVar71,0xf0);
                      auVar72 = vsubps_avx(local_2580,auVar91);
                      local_25a0 = vblendps_avx(auVar92,auVar72,0xf0);
                      local_24e0[0] = auVar96._0_4_ * 1.0;
                      local_24e0[1] = auVar96._4_4_ * 1.0;
                      local_24e0[2] = auVar96._8_4_ * 1.0;
                      local_24e0[3] = auVar96._12_4_ * 1.0;
                      fStack_24d0 = auVar96._16_4_ * -1.0;
                      fStack_24cc = auVar96._20_4_ * -1.0;
                      fStack_24c8 = auVar96._24_4_ * -1.0;
                      uStack_24c4 = auVar96._28_4_;
                      local_24c0[0] = auVar97._0_4_ * 1.0;
                      local_24c0[1] = auVar97._4_4_ * 1.0;
                      local_24c0[2] = auVar97._8_4_ * 1.0;
                      local_24c0[3] = auVar97._12_4_ * 1.0;
                      fStack_24b0 = auVar97._16_4_ * -1.0;
                      fStack_24ac = auVar97._20_4_ * -1.0;
                      fStack_24a8 = auVar97._24_4_ * -1.0;
                      uStack_24a4 = auVar97._28_4_;
                      local_24a0[0] = fVar64 * 1.0;
                      local_24a0[1] = fVar100 * 1.0;
                      local_24a0[2] = fVar101 * 1.0;
                      local_24a0[3] = fVar102 * 1.0;
                      fStack_2490 = fVar103 * -1.0;
                      fStack_248c = fVar104 * -1.0;
                      fStack_2488 = fVar105 * -1.0;
                      uStack_2484 = (uint)bVar21 * auVar81._28_4_ | (uint)!bVar21 * auVar85._28_4_;
                      auVar72 = vpbroadcastd_avx512vl();
                      auVar72 = vpaddd_avx2(auVar72,_DAT_01fec4a0);
                      auVar65 = vcvtsi2ss_avx512f(in_XMM27,*(ushort *)(local_2728 + 8 + local_2730)
                                                           - 1);
                      auVar123._4_12_ = ZEXT812(0) << 0x20;
                      auVar123._0_4_ = auVar65._0_4_;
                      auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar123);
                      auVar65 = vfnmadd213ss_fma(auVar70,auVar65,ZEXT416(0x40000000));
                      fStack_25a8 = auVar70._0_4_ * auVar65._0_4_;
                      auVar72 = vcvtdq2ps_avx(auVar72);
                      fStack_25a4 = auVar72._28_4_ + auVar71._28_4_;
                      local_25c0 = (local_2580._0_4_ * auVar72._0_4_ + auVar71._0_4_) * fStack_25a8;
                      fStack_25bc = (local_2580._4_4_ * auVar72._4_4_ + auVar71._4_4_) * fStack_25a8
                      ;
                      fStack_25b8 = (local_2580._8_4_ * auVar72._8_4_ + auVar71._8_4_) * fStack_25a8
                      ;
                      fStack_25b4 = (local_2580._12_4_ * auVar72._12_4_ + auVar71._12_4_) *
                                    fStack_25a8;
                      fStack_25b0 = (local_2580._16_4_ * auVar72._16_4_ + auVar71._16_4_) *
                                    fStack_25a8;
                      fStack_25ac = (local_2580._20_4_ * auVar72._20_4_ + auVar71._20_4_) *
                                    fStack_25a8;
                      fStack_25a8 = (local_2580._24_4_ * auVar72._24_4_ + auVar71._24_4_) *
                                    fStack_25a8;
                      pGVar15 = (local_2720->geometries).items[local_2768].ptr;
                      if ((pGVar15->mask & uVar45) != 0) {
                        auVar71 = vpbroadcastd_avx512vl();
                        auVar71 = vpaddd_avx2(auVar71,_DAT_01fec4c0);
                        auVar71 = vcvtdq2ps_avx(auVar71);
                        auVar119._0_4_ = (float)(int)(*(ushort *)(local_2728 + 10 + local_2730) - 1)
                        ;
                        auVar119._4_12_ = auVar91._4_12_;
                        auVar42._12_4_ = 0;
                        auVar42._0_12_ = ZEXT812(0);
                        auVar70 = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)auVar119._0_4_));
                        auVar65 = vfnmadd213ss_fma(auVar70,auVar119,ZEXT416(0x40000000));
                        fVar22 = auVar70._0_4_ * auVar65._0_4_;
                        auVar30._8_4_ = 0x219392ef;
                        auVar30._0_8_ = 0x219392ef219392ef;
                        auVar30._12_4_ = 0x219392ef;
                        auVar30._16_4_ = 0x219392ef;
                        auVar30._20_4_ = 0x219392ef;
                        auVar30._24_4_ = 0x219392ef;
                        auVar30._28_4_ = 0x219392ef;
                        uVar56 = vcmpps_avx512vl(local_2580,auVar30,5);
                        auVar72 = vrcp14ps_avx512vl(local_2580);
                        auVar126._8_4_ = 0x3f800000;
                        auVar126._0_8_ = 0x3f8000003f800000;
                        auVar126._12_4_ = 0x3f800000;
                        auVar126._16_4_ = 0x3f800000;
                        auVar126._20_4_ = 0x3f800000;
                        auVar126._24_4_ = 0x3f800000;
                        auVar126._28_4_ = 0x3f800000;
                        auVar65 = vfnmadd213ps_fma(local_2580,auVar72,auVar126);
                        auVar72 = vfmadd132ps_avx512vl(ZEXT1632(auVar65),auVar72,auVar72);
                        fVar104 = (float)((uint)((byte)uVar56 & 1) * auVar72._0_4_);
                        fVar118 = (float)((uint)((byte)(uVar56 >> 1) & 1) * auVar72._4_4_);
                        fVar103 = (float)((uint)((byte)(uVar56 >> 2) & 1) * auVar72._8_4_);
                        fVar102 = (float)((uint)((byte)(uVar56 >> 3) & 1) * auVar72._12_4_);
                        fVar101 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar72._16_4_);
                        fVar100 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar72._20_4_);
                        fVar64 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar72._24_4_);
                        auVar40._4_4_ = fStack_25bc * fVar118;
                        auVar40._0_4_ = local_25c0 * fVar104;
                        auVar40._8_4_ = fStack_25b8 * fVar103;
                        auVar40._12_4_ = fStack_25b4 * fVar102;
                        auVar40._16_4_ = fStack_25b0 * fVar101;
                        auVar40._20_4_ = fStack_25ac * fVar100;
                        auVar40._24_4_ = fStack_25a8 * fVar64;
                        auVar40._28_4_ = fStack_25a4;
                        local_2540 = vminps_avx(auVar40,auVar126);
                        auVar41._4_4_ =
                             (local_2580._4_4_ * auVar71._4_4_ + local_25a0._4_4_) * fVar22 *
                             fVar118;
                        auVar41._0_4_ =
                             (local_2580._0_4_ * auVar71._0_4_ + local_25a0._0_4_) * fVar22 *
                             fVar104;
                        auVar41._8_4_ =
                             (local_2580._8_4_ * auVar71._8_4_ + local_25a0._8_4_) * fVar22 *
                             fVar103;
                        auVar41._12_4_ =
                             (local_2580._12_4_ * auVar71._12_4_ + local_25a0._12_4_) * fVar22 *
                             fVar102;
                        auVar41._16_4_ =
                             (local_2580._16_4_ * auVar71._16_4_ + local_25a0._16_4_) * fVar22 *
                             fVar101;
                        auVar41._20_4_ =
                             (local_2580._20_4_ * auVar71._20_4_ + local_25a0._20_4_) * fVar22 *
                             fVar100;
                        auVar41._24_4_ =
                             (local_2580._24_4_ * auVar71._24_4_ + local_25a0._24_4_) * fVar22 *
                             fVar64;
                        auVar41._28_4_ = auVar71._28_4_ + local_25a0._28_4_;
                        local_2520 = vminps_avx(auVar41,auVar126);
                        auVar107._8_4_ = 0x7f800000;
                        auVar107._0_8_ = 0x7f8000007f800000;
                        auVar107._12_4_ = 0x7f800000;
                        auVar107._16_4_ = 0x7f800000;
                        auVar107._20_4_ = 0x7f800000;
                        auVar107._24_4_ = 0x7f800000;
                        auVar107._28_4_ = 0x7f800000;
                        auVar71 = vblendmps_avx512vl(auVar107,local_2500);
                        auVar98._0_4_ =
                             (uint)(bVar43 & 1) * auVar71._0_4_ |
                             (uint)!(bool)(bVar43 & 1) * 0x7f800000;
                        bVar21 = (bool)(bVar43 >> 1 & 1);
                        auVar98._4_4_ = (uint)bVar21 * auVar71._4_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar43 >> 2 & 1);
                        auVar98._8_4_ = (uint)bVar21 * auVar71._8_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar43 >> 3 & 1);
                        auVar98._12_4_ = (uint)bVar21 * auVar71._12_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar43 >> 4 & 1);
                        auVar98._16_4_ = (uint)bVar21 * auVar71._16_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar43 >> 5 & 1);
                        auVar98._20_4_ = (uint)bVar21 * auVar71._20_4_ | (uint)!bVar21 * 0x7f800000;
                        bVar21 = (bool)(bVar43 >> 6 & 1);
                        auVar98._24_4_ = (uint)bVar21 * auVar71._24_4_ | (uint)!bVar21 * 0x7f800000;
                        auVar98._28_4_ =
                             (uint)(bVar43 >> 7) * auVar71._28_4_ |
                             (uint)!(bool)(bVar43 >> 7) * 0x7f800000;
                        auVar71 = vshufps_avx(auVar98,auVar98,0xb1);
                        auVar71 = vminps_avx(auVar98,auVar71);
                        auVar72 = vshufpd_avx(auVar71,auVar71,5);
                        auVar71 = vminps_avx(auVar71,auVar72);
                        auVar72 = vpermpd_avx2(auVar71,0x4e);
                        auVar71 = vminps_avx(auVar71,auVar72);
                        uVar127 = vcmpps_avx512vl(auVar98,auVar71,0);
                        bVar50 = bVar43;
                        if ((bVar43 & (byte)uVar127) != 0) {
                          bVar50 = bVar43 & (byte)uVar127;
                        }
                        uVar45 = 0;
                        for (uVar51 = (uint)bVar50; (uVar51 & 1) == 0;
                            uVar51 = uVar51 >> 1 | 0x80000000) {
                          uVar45 = uVar45 + 1;
                        }
                        uVar56 = (ulong)uVar45;
                        local_27a0 = local_27a8->args;
                        if ((local_27a0->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar15->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                          local_2640 = ZEXT432((uint)(local_27b0->super_RayK<1>).tfar);
                          pRVar20 = local_27a8->user;
                          local_2660 = local_2500;
                          do {
                            local_26a4 = *(undefined4 *)(local_2540 + uVar56 * 4);
                            local_26a0 = *(undefined4 *)(local_2520 + uVar56 * 4);
                            (ray->super_RayK<1>).tfar = local_24e0[uVar56 - 8];
                            local_26b0 = local_24e0[uVar56];
                            local_26ac = local_24c0[uVar56];
                            local_26a8 = local_24a0[uVar56];
                            local_269c = (int)local_2748;
                            local_2698 = (int)local_2768;
                            local_2694 = pRVar20->instID[0];
                            local_2690 = pRVar20->instPrimID[0];
                            local_2754 = -1;
                            local_2710.valid = &local_2754;
                            local_2710.geometryUserPtr = pGVar15->userPtr;
                            local_2710.context = pRVar20;
                            local_2710.ray = (RTCRayN *)ray;
                            local_2710.hit = (RTCHitN *)&local_26b0;
                            local_2710.N = 1;
                            if (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f382b7:
                              if ((local_27a0->filter != (RTCFilterFunctionN)0x0) &&
                                 (((local_27a0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                   != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                (*local_27a0->filter)(&local_2710);
                                auVar109 = ZEXT3264(local_2660);
                                ray = local_27b0;
                                if (*local_2710.valid == 0) goto LAB_01f38359;
                              }
                              (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.x =
                                   *(float *)local_2710.hit;
                              (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2710.hit + 4);
                              (((Vec3f *)((long)local_2710.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2710.hit + 8);
                              *(float *)((long)local_2710.ray + 0x3c) =
                                   *(float *)(local_2710.hit + 0xc);
                              *(float *)((long)local_2710.ray + 0x40) =
                                   *(float *)(local_2710.hit + 0x10);
                              *(float *)((long)local_2710.ray + 0x44) =
                                   *(float *)(local_2710.hit + 0x14);
                              *(float *)((long)local_2710.ray + 0x48) =
                                   *(float *)(local_2710.hit + 0x18);
                              *(float *)((long)local_2710.ray + 0x4c) =
                                   *(float *)(local_2710.hit + 0x1c);
                              *(float *)((long)local_2710.ray + 0x50) =
                                   *(float *)(local_2710.hit + 0x20);
                            }
                            else {
                              (*pGVar15->intersectionFilterN)(&local_2710);
                              auVar109 = ZEXT3264(local_2660);
                              ray = local_27b0;
                              if (*local_2710.valid != 0) goto LAB_01f382b7;
LAB_01f38359:
                              (local_27b0->super_RayK<1>).tfar = (float)local_2640._0_4_;
                              ray = local_27b0;
                            }
                            bVar43 = ~(byte)(1 << ((uint)uVar56 & 0x1f)) & bVar43;
                            fVar118 = (ray->super_RayK<1>).tfar;
                            auVar31._4_4_ = fVar118;
                            auVar31._0_4_ = fVar118;
                            auVar31._8_4_ = fVar118;
                            auVar31._12_4_ = fVar118;
                            auVar31._16_4_ = fVar118;
                            auVar31._20_4_ = fVar118;
                            auVar31._24_4_ = fVar118;
                            auVar31._28_4_ = fVar118;
                            uVar127 = vcmpps_avx512vl(auVar109._0_32_,auVar31,2);
                            if ((bVar43 & (byte)uVar127) == 0) goto LAB_01f38113;
                            local_2640 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                            bVar43 = bVar43 & (byte)uVar127;
                            auVar108._8_4_ = 0x7f800000;
                            auVar108._0_8_ = 0x7f8000007f800000;
                            auVar108._12_4_ = 0x7f800000;
                            auVar108._16_4_ = 0x7f800000;
                            auVar108._20_4_ = 0x7f800000;
                            auVar108._24_4_ = 0x7f800000;
                            auVar108._28_4_ = 0x7f800000;
                            auVar71 = vblendmps_avx512vl(auVar108,auVar109._0_32_);
                            auVar99._0_4_ =
                                 (uint)(bVar43 & 1) * auVar71._0_4_ |
                                 (uint)!(bool)(bVar43 & 1) * 0x7f800000;
                            bVar21 = (bool)(bVar43 >> 1 & 1);
                            auVar99._4_4_ =
                                 (uint)bVar21 * auVar71._4_4_ | (uint)!bVar21 * 0x7f800000;
                            bVar21 = (bool)(bVar43 >> 2 & 1);
                            auVar99._8_4_ =
                                 (uint)bVar21 * auVar71._8_4_ | (uint)!bVar21 * 0x7f800000;
                            bVar21 = (bool)(bVar43 >> 3 & 1);
                            auVar99._12_4_ =
                                 (uint)bVar21 * auVar71._12_4_ | (uint)!bVar21 * 0x7f800000;
                            bVar21 = (bool)(bVar43 >> 4 & 1);
                            auVar99._16_4_ =
                                 (uint)bVar21 * auVar71._16_4_ | (uint)!bVar21 * 0x7f800000;
                            bVar21 = (bool)(bVar43 >> 5 & 1);
                            auVar99._20_4_ =
                                 (uint)bVar21 * auVar71._20_4_ | (uint)!bVar21 * 0x7f800000;
                            bVar21 = (bool)(bVar43 >> 6 & 1);
                            auVar99._24_4_ =
                                 (uint)bVar21 * auVar71._24_4_ | (uint)!bVar21 * 0x7f800000;
                            auVar99._28_4_ =
                                 (uint)(bVar43 >> 7) * auVar71._28_4_ |
                                 (uint)!(bool)(bVar43 >> 7) * 0x7f800000;
                            auVar71 = vshufps_avx(auVar99,auVar99,0xb1);
                            auVar71 = vminps_avx(auVar99,auVar71);
                            auVar72 = vshufpd_avx(auVar71,auVar71,5);
                            auVar71 = vminps_avx(auVar71,auVar72);
                            auVar72 = vpermpd_avx2(auVar71,0x4e);
                            auVar71 = vminps_avx(auVar71,auVar72);
                            uVar127 = vcmpps_avx512vl(auVar99,auVar71,0);
                            bVar44 = (byte)uVar127 & bVar43;
                            bVar50 = bVar43;
                            if (bVar44 != 0) {
                              bVar50 = bVar44;
                            }
                            uVar14 = 0;
                            for (uVar52 = (uint)bVar50; (uVar52 & 1) == 0;
                                uVar52 = uVar52 >> 1 | 0x80000000) {
                              uVar14 = uVar14 + 1;
                            }
                            uVar56 = (ulong)uVar14;
                          } while( true );
                        }
                        fVar118 = *(float *)(local_2540 + uVar56 * 4);
                        fVar64 = *(float *)(local_2520 + uVar56 * 4);
                        fVar100 = local_24e0[uVar56];
                        fVar101 = local_24c0[uVar56];
                        fVar102 = local_24a0[uVar56];
                        (local_27b0->super_RayK<1>).tfar = local_24e0[uVar56 - 8];
                        (local_27b0->Ng).field_0.field_0.x = fVar100;
                        (local_27b0->Ng).field_0.field_0.y = fVar101;
                        (local_27b0->Ng).field_0.field_0.z = fVar102;
                        local_27b0->u = fVar118;
                        local_27b0->v = fVar64;
                        local_27b0->primID = uVar52;
                        local_27b0->geomID = uVar14;
                        pRVar20 = local_27a8->user;
                        local_27b0->instID[0] = pRVar20->instID[0];
                        local_27b0->instPrimID[0] = pRVar20->instPrimID[0];
                      }
                    }
                  }
LAB_01f38113:
                  auVar140 = ZEXT3264(local_2400);
                  auVar146 = ZEXT3264(local_2440);
                  auVar147 = ZEXT3264(local_2460);
                  auVar144 = ZEXT3264(local_2480);
                  auVar148 = ZEXT3264(local_23e0);
                  auVar71 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                  auVar149 = ZEXT3264(auVar71);
                  context = local_27a8;
                  uVar56 = local_2798;
                  uVar48 = local_2770;
                  uVar58 = local_2778;
                  uVar59 = local_2780;
                  uVar60 = local_2788;
                  uVar61 = local_2790;
                  fVar104 = local_2420;
                  fVar118 = fStack_241c;
                  fVar64 = fStack_2418;
                  fVar100 = fStack_2414;
                  fVar101 = fStack_2410;
                  fVar102 = fStack_240c;
                  fVar103 = fStack_2408;
                }
                local_2718 = local_2718 - 1 & local_2718;
              } while (local_2718 != 0);
            }
            local_2738 = local_2738 + 1;
          } while (local_2738 != local_2740);
        }
        auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
        auVar148 = ZEXT3264(auVar71);
        auVar109 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar129 = ZEXT3264(local_2680);
        auVar128 = ZEXT3264(local_26e0);
        auVar132 = ZEXT3264(_local_25e0);
        auVar136 = ZEXT3264(_local_2600);
        auVar131 = ZEXT3264(_local_2620);
        auVar139 = ZEXT3264(_DAT_01fe9900);
      }
LAB_01f3846e:
    } while (local_27c0 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }